

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandGameMode::Tick
          (CommandGameMode *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  SBarInfoCommand **ppSVar1;
  long *plVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  
  bVar3 = (this->super_SBarInfoCommandFlowControl).truth;
  uVar4 = (ulong)(this->super_SBarInfoCommandFlowControl).commands[bVar3].
                 super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
  if (uVar4 != 0) {
    ppSVar1 = (this->super_SBarInfoCommandFlowControl).commands[bVar3].
              super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
    lVar5 = 0;
    do {
      plVar2 = *(long **)((long)ppSVar1 + lVar5);
      (**(code **)(*plVar2 + 0x28))(plVar2,block,statusBar,hudChanged);
      lVar5 = lVar5 + 8;
    } while (uVar4 << 3 != lVar5);
  }
  if ((((multiplayer != false) ||
       (bVar3 = true, ((this->super_SBarInfoCommandFlowControl).field_0x34 & 1) == 0)) &&
      ((deathmatch.Value == 0 ||
       (bVar3 = true, ((this->super_SBarInfoCommandFlowControl).field_0x34 & 4) == 0)))) &&
     ((multiplayer != true || deathmatch.Value != 0 ||
      (bVar3 = true, ((this->super_SBarInfoCommandFlowControl).field_0x34 & 2) == 0)))) {
    if (teamplay.Value == true) {
      bVar3 = (bool)((byte)(this->super_SBarInfoCommandFlowControl).field_0x34 >> 3 & 1);
    }
    else {
      bVar3 = false;
    }
  }
  if (((this->super_SBarInfoCommandFlowControl).truth != bVar3) &&
     ((this->super_SBarInfoCommandFlowControl).truth = bVar3, block != (SBarInfoMainBlock *)0x0)) {
    (*(this->super_SBarInfoCommandFlowControl).super_SBarInfoCommand._vptr_SBarInfoCommand[5])
              (this,block,statusBar,1);
    return;
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			SBarInfoCommandFlowControl::Tick(block, statusBar, hudChanged);

			SetTruth((!multiplayer && (modes & SINGLEPLAYER)) ||
				(deathmatch && (modes & DEATHMATCH)) ||
				(multiplayer && !deathmatch && (modes & COOPERATIVE)) ||
				(teamplay && (modes & TEAMGAME)), block, statusBar);
		}